

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCall_getParameterValueOfObjectType_Test::testBody
          (TEST_MockExpectedCall_getParameterValueOfObjectType_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  void *pvVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  TypeForTestingExpectedFunctionCall type;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator;
  SimpleString local_a8;
  undefined **local_98;
  undefined4 *local_90;
  MockNamedValueComparatorsAndCopiersRepository local_88;
  MockNamedValueComparator local_78;
  MockNamedValue local_70;
  
  local_78._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002b7488;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&local_88);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository(&local_88);
  SimpleString::SimpleString((SimpleString *)&local_70,"type");
  MockNamedValueComparatorsAndCopiersRepository::installComparator
            (&local_88,(SimpleString *)&local_70,&local_78);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  local_98 = &PTR__TypeForTestingExpectedFunctionCall_002b9560;
  local_90 = (undefined4 *)
             operator_new(4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                          ,0x26);
  *local_90 = 1;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString((SimpleString *)&local_70,"type");
  SimpleString::SimpleString(&local_a8,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])
            (pMVar1,&local_70,&local_a8,&local_98);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_a8,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_70,pMVar1,&local_a8);
  pvVar3 = MockNamedValue::getConstObjectPointer(&local_70);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x13])
            (pUVar2,&local_98,pvVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x18e,pTVar4);
  MockNamedValue::~MockNamedValue(&local_70);
  SimpleString::~SimpleString(&local_a8);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_a8,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x29])(&local_70,pMVar1,&local_a8);
  pcVar5 = SimpleString::asCharString((SimpleString *)&local_70);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"1",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,399,pTVar4);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::~SimpleString(&local_a8);
  local_98 = &PTR__TypeForTestingExpectedFunctionCall_002b9560;
  if (local_90 != (undefined4 *)0x0) {
    operator_delete(local_90,4);
  }
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&local_88);
  return;
}

Assistant:

TEST(MockExpectedCall, getParameterValueOfObjectType)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1);
    call->withParameterOfType("type", "name", &type);
    POINTERS_EQUAL(&type, call->getInputParameter("name").getConstObjectPointer());
    STRCMP_EQUAL("1", call->getInputParameterValueString("name").asCharString());
}